

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

tensor * __thiscall
dlib::
add_layer<dlib::relu_,_dlib::add_layer<dlib::add_prev_<dlib::tag1>,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>
::get_output(add_layer<dlib::relu_,_dlib::add_layer<dlib::add_prev_<dlib::tag1>,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>
             *this)

{
  undefined8 uVar1;
  tensor *ptVar2;
  string *in_RDI;
  add_layer<dlib::relu_,_dlib::add_layer<dlib::add_prev_<dlib::tag1>,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>
  *in_stack_ffffffffffffffa8;
  undefined3 in_stack_ffffffffffffffc0;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffc4;
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  if ((in_RDI[5]._M_string_length & 0x10000) != 0) {
    uVar3 = CONCAT13(1,in_stack_ffffffffffffffc0);
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    error::error((error *)CONCAT44(in_stack_ffffffffffffffc4,uVar3),in_RDI);
    __cxa_throw(uVar1,&error::typeinfo,error::~error);
  }
  ptVar2 = private_get_output(in_stack_ffffffffffffffa8);
  return ptVar2;
}

Assistant:

const tensor& get_output() const 
        { 
            if (get_output_and_gradient_input_disabled)
                throw dlib::error("Accessing this layer's get_output() is disabled because an in-place layer has been stacked on top of it.");
            return private_get_output(); 
        }